

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

QStringList *
QFontDatabase::families(QStringList *__return_storage_ptr__,WritingSystem writingSystem)

{
  QtFontFamily *pQVar1;
  QArrayData *pQVar2;
  long lVar3;
  int iVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QDeadlineTimer QVar8;
  QLatin1String QVar9;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)__return_storage_ptr__);
  if (pTVar5 != (Type *)0x0) {
    QVar8.t2 = 0xffffffff;
    QVar8.type = 0x7fffffff;
    QVar8.t1 = (qint64)pTVar5;
    QRecursiveMutex::tryLock(QVar8);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  if (0 < QFontDatabasePrivate::instance::instance.count) {
    lVar6 = 0;
    do {
      pQVar1 = QFontDatabasePrivate::instance::instance.families[lVar6];
      if (((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
           (undefined1  [112])0x0) || (pQVar1->count != 0)) {
        if (writingSystem != Any) {
          if ((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
              (undefined1  [112])0x0) {
            iVar4 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])
                              ();
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                      ((long *)CONCAT44(extraout_var,iVar4),&pQVar1->name);
            if ((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
                (undefined1  [112])0x0) goto LAB_0025b988;
          }
          if (pQVar1->writingSystems[writingSystem] != '\x01') goto LAB_0025b988;
        }
        if (((undefined1  [112])((undefined1  [112])*pQVar1 & (undefined1  [112])0x1) ==
             (undefined1  [112])0x0) || (pQVar1->count == 1)) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&pQVar1->name);
          QList<QString>::end(__return_storage_ptr__);
        }
        else if (0 < pQVar1->count) {
          lVar7 = 0;
          do {
            local_58.d.d = (pQVar1->name).d.d;
            local_58.d.ptr = (pQVar1->name).d.ptr;
            local_58.d.size = (pQVar1->name).d.size;
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pQVar2 = &((pQVar1->foundries[lVar7]->name).d.d)->super_QArrayData;
            lVar3 = (pQVar1->foundries[lVar7]->name).d.size;
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (lVar3 != 0) {
              QVar9.m_data = (char *)0x2;
              QVar9.m_size = (qsizetype)&local_58;
              QString::append(QVar9);
              QString::append(&local_58);
              QString::append((QChar)(char16_t)&local_58);
            }
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_58);
            QList<QString>::end(__return_storage_ptr__);
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar2,2,0x10);
              }
            }
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pQVar1->count);
        }
      }
LAB_0025b988:
      lVar6 = lVar6 + 1;
    } while (lVar6 < QFontDatabasePrivate::instance::instance.count);
  }
  if (pTVar5 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QFontDatabase::families(WritingSystem writingSystem)
{
    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QStringList flist;
    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (writingSystem != Any) {
            if (!f->ensurePopulated())
                continue;
            if (f->writingSystems[writingSystem] != QtFontFamily::Supported)
                continue;
        }
        if (!f->populated || f->count == 1) {
            flist.append(f->name);
        } else {
            for (int j = 0; j < f->count; j++) {
                QString str = f->name;
                QString foundry = f->foundries[j]->name;
                if (!foundry.isEmpty()) {
                    str += " ["_L1;
                    str += foundry;
                    str += u']';
                }
                flist.append(str);
            }
        }
    }
    return flist;
}